

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void process_func_decls_for_allocation(c2m_ctx_t c2m_ctx)

{
  uchar uVar1;
  int iVar2;
  node_code_t nVar3;
  check_ctx *pcVar4;
  byte *pbVar5;
  decl_t pdVar6;
  undefined1 *puVar7;
  node_t_conflict pnVar8;
  undefined1 *puVar9;
  decl_t *ppdVar10;
  char *pcVar11;
  ulong uVar12;
  node_t pnVar13;
  node_t pnVar14;
  mir_size_t mVar15;
  mir_size_t mVar16;
  ulong extraout_RAX;
  ulong uVar17;
  node_t pnVar18;
  type *el;
  arr_type *paVar19;
  node_t_conflict pnVar20;
  decl_spec *pdVar21;
  type *ptVar22;
  VARR_decl_t *pVVar23;
  node_t pnVar24;
  int extraout_EDX;
  node_t_conflict extraout_RDX;
  node_t_conflict pnVar25;
  long lVar26;
  node_t_conflict in_RSI;
  type *el_00;
  c2m_ctx_t c2m_ctx_00;
  c2m_ctx_t pcVar27;
  node_t pnVar28;
  ulong uVar29;
  long *plVar30;
  pos_t pVar31;
  long local_48;
  node_t_conflict local_40;
  
  pcVar4 = c2m_ctx->check_ctx;
  pVVar23 = pcVar4->func_decls_for_allocation;
  c2m_ctx_00 = c2m_ctx;
  if (pVVar23 != (VARR_decl_t *)0x0) {
    in_RSI = (node_t_conflict)0x0;
    pnVar20 = (node_t_conflict)0x0;
    do {
      pnVar25 = (node_t_conflict)pVVar23->els_num;
      c2m_ctx_00 = (c2m_ctx_t)pVVar23->varr;
      local_40 = in_RSI;
      if (pnVar25 <= pnVar20) goto LAB_001865b7;
      if (c2m_ctx_00 == (c2m_ctx_t)0x0) {
        process_func_decls_for_allocation_cold_6();
        local_40 = in_RSI;
        goto LAB_0018677e;
      }
      pbVar5 = (byte *)c2m_ctx_00->env[0].__jmpbuf[(long)(&pnVar20[-1].u.ch + 0xe)];
      iVar2 = *(int *)(*(long *)(pbVar5 + 0x40) + 0x18);
      if ((iVar2 - 2U < 2) ||
         ((iVar2 == 1 && (*(int *)(*(long *)(pbVar5 + 0x40) + 0x30) - 2U < 0xf)))) {
        *pbVar5 = *pbVar5 | 2;
      }
      else {
        if (pnVar25 <= in_RSI) goto LAB_00186783;
        c2m_ctx_00->env[0].__jmpbuf[(long)(&in_RSI[-1].u.ch + 0xe)] = (long)pbVar5;
        in_RSI = (node_t_conflict)((long)&in_RSI->code + 1);
      }
      pVVar23 = pcVar4->func_decls_for_allocation;
      pnVar20 = (node_t_conflict)((long)&pnVar20->code + 1);
    } while (pVVar23 != (VARR_decl_t *)0x0);
  }
  process_func_decls_for_allocation_cold_7();
  pnVar25 = extraout_RDX;
  local_40 = in_RSI;
LAB_001865b7:
  if ((c2m_ctx_00 != (c2m_ctx_t)0x0) && (local_40 <= pnVar25)) {
    pVVar23->els_num = (size_t)local_40;
    qsort(c2m_ctx_00,(size_t)local_40,8,decl_cmp);
    pVVar23 = pcVar4->func_decls_for_allocation;
    if (pVVar23 != (VARR_decl_t *)0x0) {
      local_48 = 0;
      local_40 = (node_t_conflict)0x0;
      uVar29 = 0;
      do {
        uVar17 = pVVar23->els_num;
        if (uVar17 <= uVar29) goto LAB_00186706;
        if (pVVar23->varr == (decl_t *)0x0) goto LAB_0018677e;
        pdVar6 = pVVar23->varr[uVar29];
        pnVar20 = pdVar6->scope;
        ptVar22 = (pdVar6->decl_spec).type;
        puVar7 = (undefined1 *)pnVar20->attr;
        if (pnVar20 == local_40) {
          lVar26 = *(long *)(puVar7 + 0x10);
        }
        else {
          lVar26 = *(long *)(puVar7 + 0x10);
          pnVar25 = *(node_t_conflict *)(puVar7 + 0x20);
          pnVar8 = c2m_ctx->top_scope;
          if (pnVar25 != pnVar8) {
            do {
              puVar9 = (undefined1 *)pnVar25->attr;
              lVar26 = lVar26 + *(long *)(puVar9 + 8);
              *puVar9 = 1;
              pnVar25 = *(node_t_conflict *)(puVar9 + 0x20);
            } while (pnVar25 != pnVar8);
            *(long *)(puVar7 + 0x10) = lVar26;
          }
          *puVar7 = 1;
          local_48 = lVar26;
          local_40 = pnVar20;
        }
        mVar15 = var_align(c2m_ctx,ptVar22);
        uVar17 = lVar26 + -1 + mVar15;
        mVar15 = uVar17 - uVar17 % mVar15;
        *(mir_size_t *)(puVar7 + 0x10) = mVar15;
        pdVar6->offset = mVar15;
        mVar15 = raw_type_size(c2m_ctx,ptVar22);
        c2m_ctx_00 = c2m_ctx;
        mVar16 = var_align(c2m_ctx,ptVar22);
        uVar17 = (mVar15 - 1) + mVar16;
        uVar29 = uVar29 + 1;
        lVar26 = (uVar17 - uVar17 % mVar16) + *(long *)(puVar7 + 0x10);
        *(long *)(puVar7 + 0x10) = lVar26;
        *(long *)(puVar7 + 8) = lVar26 - local_48;
        pVVar23 = pcVar4->func_decls_for_allocation;
      } while (pVVar23 != (VARR_decl_t *)0x0);
    }
    process_func_decls_for_allocation_cold_3();
    uVar17 = extraout_RAX;
LAB_00186706:
    if (uVar17 == 0) {
      return;
    }
    ppdVar10 = pVVar23->varr;
    if (ppdVar10 != (decl_t *)0x0) {
      pnVar20 = (node_t_conflict)0x0;
      uVar29 = 0;
      do {
        pnVar25 = ppdVar10[uVar29]->scope;
        if (pnVar25 != pnVar20) {
          pcVar11 = (char *)pnVar25->attr;
          pnVar20 = c2m_ctx->top_scope;
          pnVar25 = *(node_t_conflict *)(pcVar11 + 0x20);
          if (pnVar25 != pnVar20) {
            uVar12 = *(ulong *)(pcVar11 + 0x10);
            do {
              puVar7 = (undefined1 *)pnVar25->attr;
              if (*(ulong *)(puVar7 + 8) < uVar12) {
                *(ulong *)(puVar7 + 8) = uVar12;
              }
              if (*pcVar11 != '\0') {
                *puVar7 = 1;
              }
              pnVar25 = *(node_t_conflict *)(puVar7 + 0x20);
            } while (pnVar25 != pnVar20);
          }
        }
        uVar29 = uVar29 + 1;
      } while (uVar29 != uVar17);
      return;
    }
    goto LAB_0018678d;
  }
LAB_00186788:
  process_func_decls_for_allocation_cold_4();
LAB_0018678d:
  process_func_decls_for_allocation_cold_1();
  pnVar18 = (local_40->u).ops.head;
  if (pnVar18 == (node_t)0x0) {
    pnVar18 = (node_t)0x0;
  }
  else {
    pnVar18 = (pnVar18->op_link).next;
  }
  if (local_40->code != N_DECL) {
    __assert_fail("r->code == N_DECL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x1b49,"struct type *check_declarator(c2m_ctx_t, node_t, int)");
  }
  pnVar18 = (pnVar18->u).ops.head;
  if (pnVar18 != (node_t)0x0) {
    pcVar4 = c2m_ctx_00->check_ctx;
    ptVar22 = (type *)0x0;
    do {
      el = (type *)reg_malloc(c2m_ctx_00,0x38);
      *(byte *)&el->type_qual = *(byte *)&el->type_qual & 0xf0;
      el->mode = TM_UNDEF;
      el->antialias = 0;
      el->arr_type = (type *)0x0;
      el->align = -1;
      el->raw_size = 0xffffffffffffffff;
      el->func_type_before_adjustment_p = '\0';
      el->unnamed_anon_struct_union_member_type_p = '\0';
      el->pos_node = pnVar18;
      nVar3 = pnVar18->code;
      if (nVar3 == N_FUNC) {
        pnVar28 = (pnVar18->u).ops.head;
        el_00 = (type *)0x20;
        uVar1 = pcVar4->in_params_p;
        pnVar13 = (pnVar28->u).ops.tail;
        el->mode = TM_FUNC;
        el->pos_node = pnVar18;
        pcVar27 = c2m_ctx_00;
        pnVar20 = (node_t_conflict)reg_malloc(c2m_ctx_00,0x20);
        (el->u).tag_type = pnVar20;
        pnVar20->attr = (void *)0x0;
        (pnVar20->op_link).next = (node_t)0x0;
        if (pnVar13 == (node_t)0x0) {
          *(undefined1 *)&pnVar20->code = (char)pnVar20->code & (N_ATTR|N_MODULE);
        }
        else {
          nVar3 = pnVar13->code;
          *(undefined1 *)&pnVar20->code = (char)pnVar20->code & (N_ATTR|N_MODULE) | nVar3 == N_DOTS;
          if (nVar3 == N_DOTS) {
            pnVar14 = (pnVar13->op_link).prev;
            if (pnVar14 == (node_t)0x0) {
              if ((node_t)(pnVar28->u).s.s != pnVar13) {
                check_declarator_cold_1();
                goto LAB_00186b99;
              }
              pnVar24 = (pnVar13->op_link).next;
              (pnVar28->u).ops.head = pnVar24;
            }
            else {
              pnVar24 = (pnVar13->op_link).next;
              (pnVar14->op_link).next = pnVar24;
            }
            if (pnVar24 == (node_t)0x0) {
              if ((node_t)(pnVar28->u).s.len != pnVar13) {
LAB_00186b99:
                check_declarator_cold_2();
                if (pcVar27 != (c2m_ctx_t)0x0) {
                  iVar2 = (int)pcVar27->env[0].__jmpbuf[1];
                  if ((iVar2 == 7) || (iVar2 == 6)) {
                    plVar30 = (long *)(pcVar27->env[0].__jmpbuf[4] + 8);
                  }
                  else {
                    if (iVar2 != 3) {
                      __assert_fail("head->mode == TM_FUNC",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                                    ,0x1b18,"struct type *append_type(struct type *, struct type *)"
                                   );
                    }
                    plVar30 = pcVar27->env[0].__jmpbuf + 4;
                  }
                  ptVar22 = append_type((type *)*plVar30,el_00);
                  *plVar30 = (long)ptVar22;
                }
                return;
              }
              (pnVar28->u).ops.tail = pnVar14;
            }
            else {
              (pnVar24->op_link).prev = pnVar14;
            }
            (pnVar13->op_link).prev = (node_t)0x0;
            (pnVar13->op_link).next = (node_t)0x0;
          }
        }
        if (extraout_EDX == 0) {
          create_node_scope(c2m_ctx_00,pnVar18);
        }
        (pnVar20->op_link).prev = pnVar28;
        pcVar4->in_params_p = '\x01';
        pnVar20 = (pnVar28->u).ops.head;
        if (pnVar20 != (node_t_conflict)0x0) {
          pnVar28 = pnVar20;
          if ((pnVar20->code != N_ID) &&
             (check(c2m_ctx_00,pnVar20,pnVar18), pnVar20->code == N_TYPE)) {
            pbVar5 = (byte *)pnVar20->attr;
            lVar26 = *(long *)(pbVar5 + 0x18);
            if ((*(int *)(lVar26 + 0x18) == 1) && (*(int *)(lVar26 + 0x30) == 1)) {
              if (((((*pbVar5 & 0xef) != 0) || (*pbVar5 != 0)) || (*(long *)(pbVar5 + 8) != 0)) ||
                 ((*(byte *)(lVar26 + 0x14) & 0xf) != 0)) {
                pVar31 = get_node_pos((c2m_ctx_t)c2m_ctx_00->node_positions,
                                      (node_t_conflict)(ulong)pnVar20->uid);
                error(c2m_ctx_00,0x1c054c,pVar31.fname,pVar31._8_8_);
              }
              if ((pnVar20->op_link).next != (node_t)0x0) {
                pVar31 = get_node_pos((c2m_ctx_t)c2m_ctx_00->node_positions,
                                      (node_t_conflict)(ulong)pnVar20->uid);
                error(c2m_ctx_00,0x1c0565,pVar31.fname,pVar31._8_8_);
              }
              goto LAB_00186aa3;
            }
          }
          do {
            if (pnVar28->code == N_ID) {
              if (extraout_EDX != 0) {
                pcVar4->in_params_p = uVar1;
                goto LAB_00186b1d;
              }
              pVar31 = get_node_pos((c2m_ctx_t)c2m_ctx_00->node_positions,
                                    (node_t_conflict)(ulong)pnVar28->uid);
              error(c2m_ctx_00,0x1c0585,pVar31.fname,pVar31._8_8_);
              pcVar4->in_params_p = uVar1;
              goto LAB_00186b08;
            }
            if (pnVar28 != pnVar20) {
              check(c2m_ctx_00,pnVar28,pnVar18);
            }
            pdVar21 = get_param_decl_spec(pnVar28);
            adjust_param_type(c2m_ctx_00,&pdVar21->type);
            pnVar28 = (pnVar28->op_link).next;
          } while (pnVar28 != (node_t)0x0);
        }
LAB_00186aa3:
        pcVar4->in_params_p = uVar1;
        if (extraout_EDX == 0) {
LAB_00186b08:
          c2m_ctx_00->check_ctx->curr_scope =
               *(node_t_conflict *)((long)c2m_ctx_00->check_ctx->curr_scope->attr + 0x20);
        }
      }
      else if (nVar3 == N_ARR) {
        pnVar28 = (pnVar18->u).ops.head;
        pnVar13 = (pnVar28->op_link).next;
        pnVar20 = (pnVar13->op_link).next;
        el->mode = TM_ARR;
        el->pos_node = pnVar18;
        paVar19 = (arr_type *)reg_malloc(c2m_ctx_00,0x20);
        (el->u).arr_type = paVar19;
        *(byte *)&paVar19->ind_type_qual = *(byte *)&paVar19->ind_type_qual & 0xf0;
        set_type_qual(c2m_ctx_00,(pnVar13->u).ops.head,&paVar19->ind_type_qual,TM_UNDEF);
        check(c2m_ctx_00,pnVar20,pnVar18);
        paVar19->size = pnVar20;
        *(byte *)paVar19 = *(byte *)paVar19 & 0xfe | pnVar28->code == N_STATIC;
        paVar19->el_type = (type *)0x0;
      }
      else {
        if (nVar3 != N_POINTER) {
          abort();
        }
        pnVar28 = (pnVar18->u).ops.head;
        el->mode = TM_PTR;
        el->pos_node = pnVar18;
        (el->u).tag_type = (node_t_conflict)0x0;
        set_type_qual(c2m_ctx_00,(pnVar28->u).ops.head,&el->type_qual,TM_PTR);
      }
LAB_00186b1d:
      ptVar22 = append_type(ptVar22,el);
      pnVar18 = (pnVar18->op_link).next;
    } while (pnVar18 != (node_t)0x0);
  }
  return;
LAB_0018677e:
  process_func_decls_for_allocation_cold_2();
LAB_00186783:
  process_func_decls_for_allocation_cold_5();
  goto LAB_00186788;
}

Assistant:

static void process_func_decls_for_allocation (c2m_ctx_t c2m_ctx) {
  check_ctx_t check_ctx = c2m_ctx->check_ctx;
  size_t i, j;
  decl_t decl;
  struct type *type;
  struct node_scope *ns, *curr_ns;
  node_t scope;
  mir_size_t start_offset = 0; /* to remove an uninitialized warning */

  /* Exclude decls which will be in regs: */
  for (i = j = 0; i < VARR_LENGTH (decl_t, func_decls_for_allocation); i++) {
    decl = VARR_GET (decl_t, func_decls_for_allocation, i);
    type = decl->decl_spec.type;
    ns = decl->scope->attr;
    if (scalar_type_p (type)) {
      decl->reg_p = TRUE;
      continue;
    }
    VARR_SET (decl_t, func_decls_for_allocation, j, decl);
    j++;
  }
  VARR_TRUNC (decl_t, func_decls_for_allocation, j);
  qsort (VARR_ADDR (decl_t, func_decls_for_allocation), j, sizeof (decl_t), decl_cmp);
  scope = NULL;
  for (i = 0; i < VARR_LENGTH (decl_t, func_decls_for_allocation); i++) {
    decl = VARR_GET (decl_t, func_decls_for_allocation, i);
    type = decl->decl_spec.type;
    ns = decl->scope->attr;
    if (decl->scope != scope) { /* new scope: process upper scopes */
      for (scope = ns->scope; scope != top_scope; scope = curr_ns->scope) {
        curr_ns = scope->attr;
        ns->offset += curr_ns->size;
        curr_ns->stack_var_p = TRUE;
      }
      scope = decl->scope;
      ns->stack_var_p = TRUE;
      start_offset = ns->offset;
    }
    ns->offset = round_size (ns->offset, var_align (c2m_ctx, type));
    decl->offset = ns->offset;
    ns->offset += var_size (c2m_ctx, type);
    ns->size = ns->offset - start_offset;
  }
  scope = NULL;
  for (i = 0; i < VARR_LENGTH (decl_t, func_decls_for_allocation); i++) { /* update scope sizes: */
    decl = VARR_GET (decl_t, func_decls_for_allocation, i);
    ns = decl->scope->attr;
    if (decl->scope == scope) continue;
    /* new scope: update upper scope sizes */
    for (scope = ns->scope; scope != top_scope; scope = curr_ns->scope) {
      curr_ns = scope->attr;
      if (curr_ns->size < ns->offset) curr_ns->size = ns->offset;
      if (ns->stack_var_p) curr_ns->stack_var_p = TRUE;
    }
  }
}